

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

int oSplitByDep(Abc_Ntk_t *pNtk,Vec_Int_t **oDep,Vec_Int_t **oMatch,int *oGroup,int *oLastItem,
               int *iGroup)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int local_60;
  int encode;
  int factor;
  Vec_Int_t *sortedArray;
  Vec_Int_t *array;
  int numOfItemsAdded;
  int k;
  int j;
  int i;
  int *iGroup_local;
  int *oLastItem_local;
  int *oGroup_local;
  Vec_Int_t **oMatch_local;
  Vec_Int_t **oDep_local;
  Abc_Ntk_t *pNtk_local;
  
  array._0_4_ = 0;
  for (k = 0; k < *oLastItem; k = k + 1) {
    iVar2 = Vec_IntSize(oMatch[k]);
    if (iVar2 != 1) {
      iVar2 = Vec_IntSize(oMatch[k]);
      p = Vec_IntAlloc(iVar2);
      iVar2 = Vec_IntSize(oMatch[k]);
      p_00 = Vec_IntAlloc(iVar2);
      for (numOfItemsAdded = 0; iVar2 = Vec_IntSize(oMatch[k]), numOfItemsAdded < iVar2;
          numOfItemsAdded = numOfItemsAdded + 1) {
        local_60 = 0;
        array._4_4_ = 0;
        while( true ) {
          iVar2 = Vec_IntEntry(oMatch[k],numOfItemsAdded);
          iVar2 = Vec_IntSize(oDep[iVar2]);
          if (iVar2 <= array._4_4_) break;
          iVar2 = Vec_IntEntry(oMatch[k],numOfItemsAdded);
          iVar2 = Vec_IntEntry(oDep[iVar2],array._4_4_);
          local_60 = iGroup[iVar2] + local_60;
          array._4_4_ = array._4_4_ + 1;
        }
        Vec_IntPush(p,local_60);
        Vec_IntPushUniqueOrder(p_00,local_60);
        if (local_60 < 0) {
          printf("WARNING! Integer overflow!");
        }
      }
      while (iVar2 = Vec_IntSize(p_00), 1 < iVar2) {
        for (array._4_4_ = 0; iVar2 = Vec_IntSize(oMatch[k]), array._4_4_ < iVar2;
            array._4_4_ = array._4_4_ + 1) {
          iVar2 = Vec_IntEntry(p,array._4_4_);
          iVar3 = Vec_IntEntryLast(p_00);
          if (iVar2 == iVar3) {
            pVVar1 = oMatch[*oLastItem + (int)array];
            iVar2 = Vec_IntEntry(oMatch[k],array._4_4_);
            Vec_IntPush(pVVar1,iVar2);
            iVar2 = *oLastItem;
            iVar3 = Vec_IntEntry(oMatch[k],array._4_4_);
            oGroup[iVar3] = iVar2 + (int)array;
            pVVar1 = oMatch[k];
            iVar2 = Vec_IntEntry(oMatch[k],array._4_4_);
            Vec_IntRemove(pVVar1,iVar2);
            iVar2 = Vec_IntEntry(p,array._4_4_);
            Vec_IntRemove(p,iVar2);
            array._4_4_ = array._4_4_ + -1;
          }
        }
        array._0_4_ = (int)array + 1;
        Vec_IntPop(p_00);
      }
      Vec_IntFree(p);
      Vec_IntFree(p_00);
    }
  }
  *oLastItem = (int)array + *oLastItem;
  return (int)array;
}

Assistant:

int oSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** oDep, Vec_Int_t** oMatch, int* oGroup, int* oLastItem, int* iGroup)
{
    int i, j, k;
    int numOfItemsAdded;
    Vec_Int_t * array, * sortedArray;    

    numOfItemsAdded = 0;

    for(i = 0; i < *oLastItem; i++)
    {
        if(Vec_IntSize(oMatch[i]) == 1)
            continue;

        array = Vec_IntAlloc( Vec_IntSize(oMatch[i]) );
        sortedArray = Vec_IntAlloc( Vec_IntSize(oMatch[i]) );

        for(j = 0; j < Vec_IntSize(oMatch[i]); j++)
        {
            int factor, encode;

            encode = 0;
            factor = 1;    
            
            for(k = 0; k < Vec_IntSize(oDep[Vec_IntEntry(oMatch[i], j)]); k++)                                        
                encode += iGroup[Vec_IntEntry(oDep[Vec_IntEntry(oMatch[i], j)], k)] * factor;                        
            
            Vec_IntPush(array, encode);
            Vec_IntPushUniqueOrder(sortedArray, encode);

            if( encode < 0)
                printf("WARNING! Integer overflow!");

            //printf("%d ", Vec_IntEntry(array, j));
        }                
        
        while( Vec_IntSize(sortedArray) > 1 )
        {            
            for(k = 0; k < Vec_IntSize(oMatch[i]); k++) 
            {
                if(Vec_IntEntry(array, k) == Vec_IntEntryLast(sortedArray))
                {
                    Vec_IntPush(oMatch[*oLastItem+numOfItemsAdded], Vec_IntEntry(oMatch[i], k));
                    oGroup[Vec_IntEntry(oMatch[i], k)] = *oLastItem+numOfItemsAdded;
                    Vec_IntRemove( oMatch[i], Vec_IntEntry(oMatch[i], k) );        
                    Vec_IntRemove( array, Vec_IntEntry(array, k) );            
                    k--;
                }    
            }            
            numOfItemsAdded++;
            Vec_IntPop(sortedArray);                        
        }

        Vec_IntFree( array );        
        Vec_IntFree( sortedArray );        
        //printf("\n");
    }    

    *oLastItem += numOfItemsAdded;

    /*printf("\n");
    for(j = 0; j < *oLastItem ; j++)
    {
        printf("oMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(oMatch[j]); i++)
            printf("%d ", Vec_IntEntry(oMatch[j], i));
        printf("\n");
    }*/

    return numOfItemsAdded;
}